

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     PutTestObject<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>,_128UL,_8UL>
     ::reentrant_consume(reentrant_consume_operation *i_consume)

{
  bool bVar1;
  runtime_type<> *this;
  TestObject<128UL,_8UL> *this_00;
  reentrant_consume_operation *i_consume_local;
  
  this = density::
         sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
         ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)i_consume);
  bVar1 = density::runtime_type<>::is<density_tests::TestObject<128ul,8ul>>(this);
  if (!bVar1) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x156);
  }
  this_00 = density::
            sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
            ::reentrant_consume_operation::element<density_tests::TestObject<128ul,8ul>>
                      ((reentrant_consume_operation *)i_consume);
  TestObject<128UL,_8UL>::check(this_00);
  return;
}

Assistant:

static void
              reentrant_consume(const typename QUEUE::reentrant_consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                i_consume.template element<ElementType>().check();
            }